

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

StackVersion
ts_parser__reduce(TSParser *self,StackVersion version,TSSymbol symbol,uint32_t count,
                 int dynamic_precedence,uint16_t alias_sequence_id,_Bool fragile)

{
  Stack *self_00;
  MutableSubtree MVar1;
  Subtree *pSVar2;
  _Bool _Var3;
  TSStateId state_00;
  TSStateId state_01;
  uint version_00;
  uint32_t uVar4;
  MutableSubtree *pMVar5;
  StackSlice *pSVar6;
  Subtree subtree;
  StackSliceArray SVar7;
  uint32_t local_fc;
  _Bool local_e6;
  _Bool local_e5;
  StackVersion local_d8;
  uint local_d4;
  StackVersion j_1;
  uint32_t j;
  undefined1 auStack_c0 [4];
  TSStateId next_state;
  TSStateId state;
  SubtreeArray children_1;
  StackSlice next_slice_1;
  MutableSubtree parent;
  SubtreeArray children;
  StackSlice next_slice;
  MutableSubtree MStack_60;
  StackVersion slice_version;
  StackSlice slice;
  StackSlice *pSStack_40;
  uint32_t i;
  StackSliceArray pop;
  uint32_t removed_version_count;
  uint32_t initial_version_count;
  _Bool fragile_local;
  uint16_t alias_sequence_id_local;
  int dynamic_precedence_local;
  uint32_t count_local;
  TSSymbol symbol_local;
  StackVersion version_local;
  TSParser *self_local;
  
  local_fc = ts_stack_version_count(self->stack);
  pop.capacity = 0;
  SVar7 = ts_stack_pop_count(self->stack,version,count);
  slice._20_4_ = 0;
  do {
    pop.contents._0_4_ = SVar7.size;
    if ((uint)pop.contents <= (uint)slice._20_4_) {
      uVar4 = ts_stack_version_count(self->stack);
      if (uVar4 <= local_fc) {
        local_fc = 0xffffffff;
      }
      return local_fc;
    }
    pSStack_40 = SVar7.contents;
    pMVar5 = (MutableSubtree *)(pSStack_40 + (uint)slice._20_4_);
    MStack_60 = *pMVar5;
    slice.subtrees.contents = (Subtree *)pMVar5[1].ptr;
    slice.subtrees._8_8_ = pMVar5[2];
    version_00 = slice.subtrees.size - pop.capacity;
    MVar1 = MStack_60;
    pSVar2 = slice.subtrees.contents;
    if ((slice._20_4_ == 0) || (version_00 < 0xb)) {
      while( true ) {
        children.contents = pSVar2;
        parent = MVar1;
        local_e5 = false;
        if ((int)children.contents != 0) {
          local_e5 = ts_subtree_extra(*(Subtree *)
                                       (&(parent.ptr)->ref_count +
                                       (ulong)((int)children.contents - 1) * 2));
        }
        if (local_e5 == false) break;
        children.contents = (Subtree *)CONCAT44(children.contents._4_4_,(int)children.contents + -1)
        ;
        MVar1 = parent;
        pSVar2 = children.contents;
      }
      next_slice_1._16_8_ =
           ts_subtree_new_node(&self->tree_pool,symbol,(SubtreeArray *)&parent.data,
                               (uint)alias_sequence_id,self->language);
      while (slice._20_4_ + 1 < (uint)pop.contents) {
        pSVar6 = pSStack_40 + (slice._20_4_ + 1);
        children_1._8_8_ = (pSVar6->subtrees).contents;
        next_slice_1.subtrees.contents = *(Subtree **)&(pSVar6->subtrees).size;
        next_slice_1.subtrees.size = pSVar6->version;
        next_slice_1.subtrees.capacity = *(uint32_t *)&pSVar6->field_0x14;
        if (next_slice_1.subtrees.size != slice.subtrees.size) break;
        slice._20_4_ = slice._20_4_ + 1;
        _auStack_c0 = (Subtree *)children_1._8_8_;
        children_1.contents = next_slice_1.subtrees.contents;
        while( true ) {
          local_e6 = false;
          if ((int)children_1.contents != 0) {
            local_e6 = ts_subtree_extra(_auStack_c0[(int)children_1.contents - 1]);
          }
          if (local_e6 == false) break;
          children_1.contents =
               (Subtree *)CONCAT44(children_1.contents._4_4_,(int)children_1.contents + -1);
        }
        _Var3 = ts_parser__replace_children
                          (self,(MutableSubtree *)&next_slice_1.version,(SubtreeArray *)auStack_c0);
        if (_Var3) {
          ts_subtree_array_delete(&self->tree_pool,(SubtreeArray *)&stack0xffffffffffffffa0);
          MStack_60 = (MutableSubtree)children_1._8_8_;
          slice.subtrees.contents = next_slice_1.subtrees.contents;
          slice.subtrees.size = next_slice_1.subtrees.size;
          slice.subtrees.capacity = next_slice_1.subtrees.capacity;
        }
        else {
          ts_subtree_array_delete(&self->tree_pool,(SubtreeArray *)&children_1.size);
        }
      }
      *(int *)(next_slice_1._16_8_ + 0x48) =
           dynamic_precedence + *(int *)(next_slice_1._16_8_ + 0x48);
      *(uint16_t *)(next_slice_1._16_8_ + 0x4c) = alias_sequence_id;
      state_00 = ts_stack_state(self->stack,version_00);
      state_01 = ts_language_next_state(self->language,state_00,symbol);
      if (((fragile) || (1 < (uint)pop.contents)) || (1 < local_fc)) {
        *(ushort *)(next_slice_1._16_8_ + 0x2c) =
             *(ushort *)(next_slice_1._16_8_ + 0x2c) & 0xfff7 | 8;
        *(ushort *)(next_slice_1._16_8_ + 0x2c) =
             *(ushort *)(next_slice_1._16_8_ + 0x2c) & 0xffef | 0x10;
        *(TSStateId *)(next_slice_1._16_8_ + 0x2a) = TS_TREE_STATE_NONE;
      }
      else {
        *(TSStateId *)(next_slice_1._16_8_ + 0x2a) = state_00;
      }
      self_00 = self->stack;
      subtree = ts_subtree_from_mut((MutableSubtree)next_slice_1._16_8_);
      ts_stack_push(self_00,version_00,subtree,false,state_01);
      for (local_d4 = *(uint *)(next_slice_1._16_8_ + 0x24);
          local_d4 < (uint)slice.subtrees.contents; local_d4 = local_d4 + 1) {
        ts_stack_push(self->stack,version_00,
                      *(Subtree *)(&(MStack_60.ptr)->ref_count + (ulong)local_d4 * 2),false,state_01
                     );
      }
      for (local_d8 = 0; local_d8 < version_00; local_d8 = local_d8 + 1) {
        if ((local_d8 != version) &&
           (_Var3 = ts_stack_merge(self->stack,local_d8,version_00), _Var3)) {
          pop.capacity = pop.capacity + 1;
          break;
        }
      }
    }
    else {
      ts_stack_remove_version(self->stack,version_00);
      ts_subtree_array_delete(&self->tree_pool,(SubtreeArray *)&stack0xffffffffffffffa0);
      pop.capacity = pop.capacity + 1;
      for (; slice._20_4_ + 1 < (uint)pop.contents; slice._20_4_ = slice._20_4_ + 1) {
        children._8_8_ = pSStack_40[slice._20_4_ + 1].subtrees.contents;
        next_slice.subtrees.size = (uint32_t)*(undefined8 *)&pSStack_40[slice._20_4_ + 1].version;
        if (next_slice.subtrees.size != slice.subtrees.size) break;
        ts_subtree_array_delete(&self->tree_pool,(SubtreeArray *)&children.size);
      }
    }
    slice._20_4_ = slice._20_4_ + 1;
  } while( true );
}

Assistant:

static StackVersion ts_parser__reduce(TSParser *self, StackVersion version, TSSymbol symbol,
                                      uint32_t count, int dynamic_precedence,
                                      uint16_t alias_sequence_id, bool fragile) {
  uint32_t initial_version_count = ts_stack_version_count(self->stack);
  uint32_t removed_version_count = 0;
  StackSliceArray pop = ts_stack_pop_count(self->stack, version, count);

  for (uint32_t i = 0; i < pop.size; i++) {
    StackSlice slice = pop.contents[i];
    StackVersion slice_version = slice.version - removed_version_count;

    // Error recovery can sometimes cause lots of stack versions to merge,
    // such that a single pop operation can produce a lots of slices.
    // Avoid creating too many stack versions in that situation.
    if (i > 0 && slice_version > MAX_VERSION_COUNT + MAX_VERSION_COUNT_OVERFLOW) {
      ts_stack_remove_version(self->stack, slice_version);
      ts_subtree_array_delete(&self->tree_pool, &slice.subtrees);
      removed_version_count++;
      while (i + 1 < pop.size) {
        StackSlice next_slice = pop.contents[i + 1];
        if (next_slice.version != slice.version) break;
        ts_subtree_array_delete(&self->tree_pool, &next_slice.subtrees);
        i++;
      }
      continue;
    }

    // Extra tokens on top of the stack should not be included in this new parent
    // node. They will be re-pushed onto the stack after the parent node is
    // created and pushed.
    SubtreeArray children = slice.subtrees;
    while (children.size > 0 && ts_subtree_extra(children.contents[children.size - 1])) {
      children.size--;
    }

    MutableSubtree parent = ts_subtree_new_node(&self->tree_pool,
      symbol, &children, alias_sequence_id, self->language
    );

    // This pop operation may have caused multiple stack versions to collapse
    // into one, because they all diverged from a common state. In that case,
    // choose one of the arrays of trees to be the parent node's children, and
    // delete the rest of the tree arrays.
    while (i + 1 < pop.size) {
      StackSlice next_slice = pop.contents[i + 1];
      if (next_slice.version != slice.version) break;
      i++;

      SubtreeArray children = next_slice.subtrees;
      while (children.size > 0 && ts_subtree_extra(children.contents[children.size - 1])) {
        children.size--;
      }

      if (ts_parser__replace_children(self, &parent, &children)) {
        ts_subtree_array_delete(&self->tree_pool, &slice.subtrees);
        slice = next_slice;
      } else {
        ts_subtree_array_delete(&self->tree_pool, &next_slice.subtrees);
      }
    }

    parent.ptr->dynamic_precedence += dynamic_precedence;
    parent.ptr->alias_sequence_id = alias_sequence_id;

    TSStateId state = ts_stack_state(self->stack, slice_version);
    TSStateId next_state = ts_language_next_state(self->language, state, symbol);
    if (fragile || pop.size > 1 || initial_version_count > 1) {
      parent.ptr->fragile_left = true;
      parent.ptr->fragile_right = true;
      parent.ptr->parse_state = TS_TREE_STATE_NONE;
    } else {
      parent.ptr->parse_state = state;
    }

    // Push the parent node onto the stack, along with any extra tokens that
    // were previously on top of the stack.
    ts_stack_push(self->stack, slice_version, ts_subtree_from_mut(parent), false, next_state);
    for (uint32_t j = parent.ptr->child_count; j < slice.subtrees.size; j++) {
      ts_stack_push(self->stack, slice_version, slice.subtrees.contents[j], false, next_state);
    }

    for (StackVersion j = 0; j < slice_version; j++) {
      if (j == version) continue;
      if (ts_stack_merge(self->stack, j, slice_version)) {
        removed_version_count++;
        break;
      }
    }
  }

  // Return the first new stack version that was created.
  return ts_stack_version_count(self->stack) > initial_version_count
    ? initial_version_count
    : STACK_VERSION_NONE;
}